

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void telnet_receive(Plug *plug,int urgent,char *data,size_t len)

{
  Telnet *telnet;
  size_t len_local;
  char *data_local;
  int urgent_local;
  Plug *plug_local;
  
  if (urgent != 0) {
    *(undefined1 *)&plug[-5].vt = 1;
  }
  do_telnet_read((Telnet *)(plug + -0x13),data,len);
  return;
}

Assistant:

static void telnet_receive(
    Plug *plug, int urgent, const char *data, size_t len)
{
    Telnet *telnet = container_of(plug, Telnet, plug);
    if (urgent)
        telnet->in_synch = true;
    do_telnet_read(telnet, data, len);
}